

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::add_dht_node(session_impl *this,endpoint *n)

{
  bool bVar1;
  element_type *this_00;
  size_type sVar2;
  ulong uVar3;
  reference this_01;
  endpoint *n_local;
  session_impl *this_local;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    libtorrent::dht::dht_tracker::add_node(this_00,n);
  }
  else {
    sVar2 = ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
            ::size(&this->m_dht_nodes);
    if (sVar2 < 200) {
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      ::push_back(&this->m_dht_nodes,n);
    }
    else {
      sVar2 = ::std::
              vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
              ::size(&this->m_dht_nodes);
      uVar3 = random((aux *)(ulong)((int)sVar2 - 1));
      this_01 = ::std::
                vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                ::operator[](&this->m_dht_nodes,uVar3 & 0xffffffff);
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::operator=(this_01,n);
    }
  }
  return;
}

Assistant:

void session_impl::add_dht_node(udp::endpoint const& n)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_dht)
			m_dht->add_node(n);
		else if (m_dht_nodes.size() >= 200)
			m_dht_nodes[random(std::uint32_t(m_dht_nodes.size() - 1))] = n;
		else
			m_dht_nodes.push_back(n);
	}